

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

_Bool do_predset(DisasContext_conflict1 *s,int esz,int rd,int pat,_Bool setflag)

{
  uint dofs;
  uint fullsz;
  TCGContext_conflict1 *s_00;
  uint32_t oprsz;
  uint32_t maxsz;
  _Bool _Var1;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 extraout_AL_01;
  undefined1 uVar2;
  uint uVar3;
  TCGTemp *ts;
  byte bVar4;
  ulong uVar5;
  int iVar6;
  uint64_t local_60;
  TCGArg local_58;
  
  s_00 = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (!_Var1) {
    return _Var1;
  }
  fullsz = s->sve_len;
  iVar6 = rd * 0x20;
  uVar3 = decode_pred_count(fullsz,pat,esz);
  if (uVar3 == 0) {
    local_60 = 0;
    local_58 = 0;
    uVar3 = fullsz;
  }
  else {
    uVar3 = uVar3 << ((byte)esz & 0x1f);
    local_60 = pred_esz_masks_aarch64[esz];
    local_58 = local_60;
    if ((uVar3 & 0x3f) != 0) {
      bVar4 = -(char)(uVar3 & 0x3f);
      local_58 = (local_60 << (bVar4 & 0x3f)) >> (bVar4 & 0x3f);
    }
  }
  dofs = iVar6 + 0x2c10;
  ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
  if (fullsz < 0x41) {
    tcg_gen_op2_aarch64(s_00,INDEX_op_movi_i64,(TCGArg)ts,local_58);
    tcg_gen_op3_aarch64(s_00,INDEX_op_st_i64,(TCGArg)ts,(TCGArg)(s_00->cpu_env + (long)s_00),
                        (ulong)dofs);
  }
  else {
    if (local_60 == local_58) {
      oprsz = (uVar3 >> 3) + 0xf & 0xfffffff0;
      if (uVar3 < 0x48) {
        oprsz = 8;
      }
      if (oprsz * 8 == uVar3) {
        maxsz = 8;
        if (0x47 < fullsz) {
          maxsz = (fullsz >> 3) + 0xf & 0xfffffff0;
        }
        tcg_gen_gvec_dup64i_aarch64(s_00,dofs,oprsz,maxsz,local_60);
        goto LAB_0067ac8c;
      }
    }
    tcg_gen_op2_aarch64(s_00,INDEX_op_movi_i64,(TCGArg)ts,local_60);
    uVar3 = uVar3 >> 3 & 0x1ffffff8;
    if (uVar3 == 0) {
      uVar5 = 0;
    }
    else {
      uVar5 = 0;
      do {
        tcg_gen_op3_aarch64(s_00,INDEX_op_st_i64,(TCGArg)ts,(TCGArg)(s_00->cpu_env + (long)s_00),
                            (ulong)(uint)(iVar6 + 0x2c10 + (int)uVar5));
        uVar5 = uVar5 + 8;
      } while (uVar5 < uVar3);
    }
    uVar3 = (uint)uVar5;
    if (local_60 != local_58) {
      tcg_gen_op2_aarch64(s_00,INDEX_op_movi_i64,(TCGArg)ts,local_58);
      tcg_gen_op3_aarch64(s_00,INDEX_op_st_i64,(TCGArg)ts,(TCGArg)(s_00->cpu_env + (long)s_00),
                          (ulong)(dofs + uVar3));
      uVar3 = uVar3 + 8;
    }
    if (uVar3 < fullsz >> 3) {
      tcg_gen_op2_aarch64(s_00,INDEX_op_movi_i64,(TCGArg)ts,0);
      uVar5 = (ulong)uVar3;
      do {
        tcg_gen_op3_aarch64(s_00,INDEX_op_st_i64,(TCGArg)ts,(TCGArg)(s_00->cpu_env + (long)s_00),
                            (ulong)(uint)(iVar6 + 0x2c10 + (int)uVar5));
        uVar5 = uVar5 + 8;
      } while (uVar5 < fullsz >> 3);
    }
  }
LAB_0067ac8c:
  tcg_temp_free_internal_aarch64(s_00,ts);
  uVar2 = extraout_AL;
  if (setflag) {
    tcg_gen_op2_aarch64(s_00,INDEX_op_movi_i32,(TCGArg)(s_00->cpu_NF + (long)s_00),
                        -(ulong)(local_60 != 0));
    tcg_gen_op2_aarch64(s_00,INDEX_op_movi_i32,(TCGArg)(s_00->cpu_CF + (long)s_00),
                        (ulong)(local_60 == 0));
    tcg_gen_op2_aarch64(s_00,INDEX_op_movi_i32,(TCGArg)(s_00->cpu_VF + (long)s_00),0);
    uVar2 = extraout_AL_00;
    if (s_00->cpu_ZF != s_00->cpu_NF) {
      tcg_gen_op2_aarch64(s_00,INDEX_op_mov_i32,(TCGArg)(s_00->cpu_ZF + (long)s_00),
                          (TCGArg)(s_00->cpu_NF + (long)s_00));
      return (_Bool)extraout_AL_01;
    }
  }
  return (_Bool)uVar2;
}

Assistant:

static bool do_predset(DisasContext *s, int esz, int rd, int pat, bool setflag)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (!sve_access_check(s)) {
        return true;
    }

    unsigned fullsz = vec_full_reg_size(s);
    unsigned ofs = pred_full_reg_offset(s, rd);
    unsigned numelem, setsz, i;
    uint64_t word, lastword;
    TCGv_i64 t;

    numelem = decode_pred_count(fullsz, pat, esz);

    /* Determine what we must store into each bit, and how many.  */
    if (numelem == 0) {
        lastword = word = 0;
        setsz = fullsz;
    } else {
        setsz = numelem << esz;
        lastword = word = pred_esz_masks[esz];
        if (setsz % 64) {
            lastword &= MAKE_64BIT_MASK(0, setsz % 64);
        }
    }

    t = tcg_temp_new_i64(tcg_ctx);
    if (fullsz <= 64) {
        tcg_gen_movi_i64(tcg_ctx, t, lastword);
        tcg_gen_st_i64(tcg_ctx, t, tcg_ctx->cpu_env, ofs);
        goto done;
    }

    if (word == lastword) {
        unsigned maxsz = size_for_gvec(fullsz / 8);
        unsigned oprsz = size_for_gvec(setsz / 8);

        if (oprsz * 8 == setsz) {
            tcg_gen_gvec_dup64i(tcg_ctx, ofs, oprsz, maxsz, word);
            goto done;
        }
    }

    setsz /= 8;
    fullsz /= 8;

    tcg_gen_movi_i64(tcg_ctx, t, word);
    for (i = 0; i < QEMU_ALIGN_DOWN(setsz, 8); i += 8) {
        tcg_gen_st_i64(tcg_ctx, t, tcg_ctx->cpu_env, ofs + i);
    }
    if (lastword != word) {
        tcg_gen_movi_i64(tcg_ctx, t, lastword);
        tcg_gen_st_i64(tcg_ctx, t, tcg_ctx->cpu_env, ofs + i);
        i += 8;
    }
    if (i < fullsz) {
        tcg_gen_movi_i64(tcg_ctx, t, 0);
        for (; i < fullsz; i += 8) {
            tcg_gen_st_i64(tcg_ctx, t, tcg_ctx->cpu_env, ofs + i);
        }
    }

 done:
    tcg_temp_free_i64(tcg_ctx, t);

    /* PTRUES */
    if (setflag) {
        tcg_gen_movi_i32(tcg_ctx, tcg_ctx->cpu_NF, -(word != 0));
        tcg_gen_movi_i32(tcg_ctx, tcg_ctx->cpu_CF, word == 0);
        tcg_gen_movi_i32(tcg_ctx, tcg_ctx->cpu_VF, 0);
        tcg_gen_mov_i32(tcg_ctx, tcg_ctx->cpu_ZF, tcg_ctx->cpu_NF);
    }
    return true;
}